

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Define.h
# Opt level: O0

Unique<anurbs::Entry<anurbs::BrepTrim>_> __thiscall
anurbs::
new_<anurbs::Entry<anurbs::BrepTrim>,std::shared_ptr<anurbs::BrepTrim>&,std::shared_ptr<anurbs::Attributes>&>
          (anurbs *this,shared_ptr<anurbs::BrepTrim> *args,shared_ptr<anurbs::Attributes> *args_1)

{
  Entry<anurbs::BrepTrim> *this_00;
  shared_ptr<anurbs::Attributes> local_40;
  shared_ptr<anurbs::BrepTrim> local_30;
  shared_ptr<anurbs::Attributes> *local_20;
  shared_ptr<anurbs::Attributes> *args_local_1;
  shared_ptr<anurbs::BrepTrim> *args_local;
  
  local_20 = args_1;
  args_local_1 = (shared_ptr<anurbs::Attributes> *)args;
  args_local = (shared_ptr<anurbs::BrepTrim> *)this;
  this_00 = (Entry<anurbs::BrepTrim> *)operator_new(0x48);
  std::shared_ptr<anurbs::BrepTrim>::shared_ptr
            (&local_30,(shared_ptr<anurbs::BrepTrim> *)args_local_1);
  std::shared_ptr<anurbs::Attributes>::shared_ptr(&local_40,local_20);
  Entry<anurbs::BrepTrim>::Entry(this_00,&local_30,&local_40);
  std::
  unique_ptr<anurbs::Entry<anurbs::BrepTrim>,std::default_delete<anurbs::Entry<anurbs::BrepTrim>>>::
  unique_ptr<std::default_delete<anurbs::Entry<anurbs::BrepTrim>>,void>
            ((unique_ptr<anurbs::Entry<anurbs::BrepTrim>,std::default_delete<anurbs::Entry<anurbs::BrepTrim>>>
              *)this,this_00);
  std::shared_ptr<anurbs::Attributes>::~shared_ptr(&local_40);
  std::shared_ptr<anurbs::BrepTrim>::~shared_ptr(&local_30);
  return (__uniq_ptr_data<anurbs::Entry<anurbs::BrepTrim>,_std::default_delete<anurbs::Entry<anurbs::BrepTrim>_>,_true,_true>
          )(__uniq_ptr_data<anurbs::Entry<anurbs::BrepTrim>,_std::default_delete<anurbs::Entry<anurbs::BrepTrim>_>,_true,_true>
            )this;
}

Assistant:

Unique<T> new_(TArgs&&... args)
{
    return Unique<T>(new T(std::forward<TArgs>(args)...));
}